

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnCompareExpr
          (BinaryReaderInterp *this,Opcode opcode)

{
  Result RVar1;
  Location loc;
  Location local_38;
  
  local_38.field_1.field_0.last_column = 0;
  local_38.filename._M_len = (this->filename_)._M_len;
  local_38.filename._M_str = (this->filename_)._M_str;
  local_38.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  RVar1 = SharedValidator::OnCompare(&this->validator_,&local_38,opcode);
  if (RVar1.enum_ != Error) {
    Istream::Emit(this->istream_,opcode.enum_);
  }
  return (Result)(uint)(RVar1.enum_ == Error);
}

Assistant:

Result BinaryReaderInterp::OnCompareExpr(Opcode opcode) {
  CHECK_RESULT(validator_.OnCompare(GetLocation(), opcode));
  istream_.Emit(opcode);
  return Result::Ok;
}